

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O2

void __thiscall
entt::basic_registry<entt::entity>::pool_handler<Swarm>::pool_handler
          (pool_handler<Swarm> *this,pool_handler<Swarm> *param_1)

{
  storage<entt::entity,_Swarm>::storage
            (&this->super_storage<entt::entity,_Swarm>,&param_1->super_storage<entt::entity,_Swarm>)
  ;
  (this->super_storage<entt::entity,_Swarm>).super_basic_storage<entt::entity,_Swarm,_void>.
  super_sparse_set<entt::entity>._vptr_sparse_set = (_func_int **)&PTR__pool_handler_007297d8;
  this->group = param_1->group;
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>_>_>
  ::vector(&(this->construction).calls,&(param_1->construction).calls);
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>_>_>
  ::vector(&(this->update).calls,&(param_1->update).calls);
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&)>_>_>
  ::vector(&(this->destruction).calls,&(param_1->destruction).calls);
  return;
}

Assistant:

pool_handler() ENTT_NOEXCEPT = default;